

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precondition.cpp
# Opt level: O1

void __thiscall BoundaryElement::precondition_diagonal(BoundaryElement *this,double *z,double *r)

{
  double dVar1;
  Timers_BoundaryElement *pTVar2;
  size_t i;
  rep rVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  pTVar2 = this->timers_;
  rVar3 = std::chrono::_V2::steady_clock::now();
  (pTVar2->precondition).start_time_.__d.__r = rVar3;
  dVar1 = this->params_->phys_eps_;
  uVar4 = (this->elements_->super_Particles).num_;
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      z[uVar6] = r[uVar6] / ((dVar1 + 1.0) * 0.5);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (0 < (long)uVar4) {
    uVar6 = uVar4 * 2;
    do {
      z[uVar4] = r[uVar4] / ((1.0 / dVar1 + 1.0) * 0.5);
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar6);
  }
  pTVar2 = this->timers_;
  lVar5 = std::chrono::_V2::steady_clock::now();
  (pTVar2->precondition).end_time_.__d.__r = lVar5;
  (pTVar2->precondition).elapsed_time_.__r =
       (double)(lVar5 - (pTVar2->precondition).start_time_.__d.__r) / 1000000.0 +
       (pTVar2->precondition).elapsed_time_.__r;
  return;
}

Assistant:

void BoundaryElement::precondition_diagonal(double *z, double *r)
{
    timers_.precondition.start();

    double potential_coeff_1 = 0.5 * (1. +      params_.phys_eps_);
    double potential_coeff_2 = 0.5 * (1. + 1. / params_.phys_eps_);
    
    for (std::size_t i = 0;                i <     elements_.num(); ++i) z[i] = r[i] / potential_coeff_1;
    for (std::size_t i = elements_.num(); i < 2 * elements_.num(); ++i) z[i] = r[i] / potential_coeff_2;

    timers_.precondition.stop();
}